

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus_test.cpp
# Opt level: O2

bool __thiscall crn::corpus_tester::test(corpus_tester *this,char *pCmd_line)

{
  file_desc *pfVar1;
  bool bVar2;
  bool bVar3;
  uint y;
  uint num_channels;
  uint uVar4;
  _Base_ptr p_Var5;
  ulong uVar6;
  image_u8 *a_00;
  image_u8 *b_00;
  image_u8 *b_01;
  uint x;
  uint uVar7;
  uint uVar8;
  uint num_blocks_x;
  _Base_ptr *pp_Var9;
  ulong uVar10;
  char *pcVar11;
  char **ppcVar12;
  long lVar13;
  image<crnlib::color_quad<unsigned_char,_int>_> *piVar14;
  _Base_ptr p_Var15;
  uint num_blocks_y;
  undefined8 uVar16;
  uint x_00;
  uint uVar17;
  bool bVar18;
  bool bVar19;
  double dVar20;
  double dVar21;
  double local_410;
  double local_408;
  find_files file_finder;
  image_u8 img;
  vector<crnlib::image_utils::error_metrics> metrics [2];
  pack_params local_368;
  ulong local_330;
  ulong local_328;
  ulong local_320;
  error_metrics em;
  timer t;
  mipmapped_texture orig_tex;
  command_line_params cmd_line_params;
  image_u8 orig_img;
  mipmapped_texture tex1;
  error_metrics em2;
  image_u8 img2;
  image_u8 img1;
  image_u8 hybrid_img;
  image_u8 b;
  image_u8 a;
  image_u8 o;
  mipmapped_texture tex2;
  
  crnlib::console::printf("Command line:\n\"%s\"");
  crnlib::command_line_params::command_line_params(&cmd_line_params);
  bVar2 = crnlib::command_line_params::parse
                    (&cmd_line_params,pCmd_line,10,test::param_desc_array,true);
  bVar18 = false;
  if (bVar2) {
    local_410 = 0.0;
    local_408 = 0.0;
    for (p_Var5 = cmd_line_params.m_param_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &cmd_line_params.m_param_map._M_t._M_impl.super__Rb_tree_header
        ; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      bVar2 = crnlib::dynamic_string::operator!=((dynamic_string *)(p_Var5 + 1),"in");
      if (!bVar2) {
        uVar4 = *(uint *)&p_Var5[1]._M_right;
        if (uVar4 == 0) {
          crnlib::console::error("Must follow /in parameter with a filename!\n");
          bVar18 = false;
          goto LAB_00107755;
        }
        for (uVar10 = 0; uVar10 < uVar4; uVar10 = uVar10 + 1) {
          p_Var15 = p_Var5[1]._M_left;
          file_finder.m_last_error = 0;
          file_finder.m_files.m_p = (file_desc *)0x0;
          file_finder.m_files.m_size = 0;
          file_finder.m_files.m_capacity = 0;
          pcVar11 = (char *)(&p_Var15->_M_parent)[uVar10 * 2];
          bVar2 = crnlib::command_line_params::has_key(&cmd_line_params,"deep");
          if ((_Base_ptr)pcVar11 == (_Base_ptr)0x0) {
            pcVar11 = "";
          }
          bVar2 = crnlib::find_files::find(&file_finder,pcVar11,bVar2 | 4);
          pp_Var9 = &p_Var15->_M_parent + uVar10 * 2;
          if (bVar2) {
            if (file_finder.m_files.m_size == 0) {
              p_Var5 = *pp_Var9;
              p_Var15 = (_Base_ptr)"";
              if (p_Var5 != (_Base_ptr)0x0) {
                p_Var15 = p_Var5;
              }
              crnlib::console::warning("No files found: %s",p_Var15);
              crnlib::vector<crnlib::find_files::file_desc>::~vector(&file_finder.m_files);
            }
            else {
              orig_tex.m_name.m_buf_size = 0;
              orig_tex.m_name.m_len = 0xff00;
              local_330 = uVar10;
              crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::image
                        (&o,4,4,0xffffffff,(color_quad<unsigned_char,_int> *)&orig_tex,0xf);
              orig_tex.m_name.m_buf_size = 0;
              orig_tex.m_name.m_len = 0xff00;
              crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::image
                        (&a,4,4,0xffffffff,(color_quad<unsigned_char,_int> *)&orig_tex,0xf);
              orig_tex.m_name.m_buf_size = 0;
              orig_tex.m_name.m_len = 0xff00;
              crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::image
                        (&b,4,4,0xffffffff,(color_quad<unsigned_char,_int> *)&orig_tex,0xf);
              bVar2 = crnlib::command_line_params::get_value_as_bool
                                (&cmd_line_params,"perceptual",0,false);
              crnlib::console::printf("Perceptual mode: %u",(ulong)bVar2);
              num_channels = (uint)!bVar2 + (uint)!bVar2 * 2;
              uVar10 = 0;
              while (pfVar1 = file_finder.m_files.m_p,
                    bVar18 = uVar10 < (file_finder.m_files._8_8_ & 0xffffffff), bVar18) {
                pcVar11 = file_finder.m_files.m_p[uVar10].m_fullname.m_pStr;
                if (pcVar11 == (char *)0x0) {
                  pcVar11 = "";
                }
                local_328 = uVar10;
                crnlib::console::printf("-------- Loading image: %s",pcVar11);
                ppcVar12 = &pfVar1[uVar10].m_fullname.m_pStr;
                img.m_width = 0;
                img.m_height = 0;
                img.m_pitch = 0;
                img.m_total = 0;
                img.m_comp_flags = 0xf;
                img.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
                img.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
                img.m_pixel_buf.m_size = 0;
                img.m_pixel_buf.m_capacity = 0;
                pcVar11 = *ppcVar12;
                if (pcVar11 == (char *)0x0) {
                  pcVar11 = "";
                }
                bVar3 = crnlib::image_utils::read_from_file(&img,pcVar11,0);
                if (bVar3) {
                  piVar14 = (image<crnlib::color_quad<unsigned_char,_int>_> *)0x18791e;
                  bVar3 = crnlib::command_line_params::has_key(&cmd_line_params,"alpha");
                  if ((!bVar3) && ((img.m_comp_flags & 8) != 0)) {
                    for (uVar4 = 0; uVar4 < img.m_height; uVar4 = uVar4 + 1) {
                      for (uVar7 = 0; uVar7 < img.m_width; uVar7 = uVar7 + 1) {
                        piVar14 = (image<crnlib::color_quad<unsigned_char,_int>_> *)
                                  (ulong)(img.m_pitch * uVar4 + uVar7);
                        img.m_pPixels[(long)piVar14].field_0.field_0.a = 0xff;
                      }
                    }
                    img.m_comp_flags = img.m_comp_flags & 0xfffffff7;
                  }
                  crnlib::mipmapped_texture::mipmapped_texture(&orig_tex);
                  piVar14 = crnlib::
                            crnlib_new<crnlib::image<crnlib::color_quad<unsigned_char,int>>,crnlib::image<crnlib::color_quad<unsigned_char,int>>>
                                      ((crnlib *)&img,piVar14);
                  crnlib::mipmapped_texture::assign
                            (&orig_tex,piVar14,PIXEL_FMT_INVALID,cDefaultOrientationFlags);
                  bVar3 = crnlib::command_line_params::has_key(&cmd_line_params,"nomips");
                  if (!bVar3) {
                    tex1.m_name._0_8_ =
                         (long)"-mipFilter [box,tent,lanczos4,mitchell,kaiser], default=kaiser" +
                         0x38;
                    tex1.m_name.m_pStr._0_4_ = 0x100;
                    tex1._12_8_ = 0x3fe000003f666666;
                    tex1.m_height._0_1_ = 1;
                    tex1.m_comp_flags = cCompFlagRValid;
                    tex1.m_format = PIXEL_FMT_INVALID;
                    crnlib::console::printf("Generating mipmaps");
                    bVar3 = crnlib::mipmapped_texture::generate_mipmaps
                                      (&orig_tex,(generate_mipmap_params *)&tex1,false);
                    if (!bVar3) {
                      crnlib::console::error("Mipmap generation failed!");
                      crnlib::mipmapped_texture::~mipmapped_texture(&orig_tex);
                      crnlib::vector<crnlib::color_quad<unsigned_char,_int>_>::~vector
                                (&img.m_pixel_buf);
                      bVar18 = true;
                      goto LAB_00107670;
                    }
                  }
                  crnlib::console::printf("Compress 1");
                  crnlib::mipmapped_texture::mipmapped_texture(&tex1,&orig_tex);
                  local_368.m_quality = cCRNDXTQualityUber;
                  local_368.m_compressor = cCRNDXTCompressorCRN;
                  local_368.m_perceptual = true;
                  local_368.m_dithering = false;
                  local_368.m_grayscale_sampling = false;
                  local_368.m_use_both_block_types = true;
                  local_368.m_endpoint_caching = true;
                  local_368.m_pProgress_callback = (progress_callback_func)0x0;
                  local_368.m_pProgress_callback_user_data_ptr = (void *)0x0;
                  local_368.m_dxt1a_alpha_threshold = 0x80;
                  local_368.m_num_helper_threads = 0;
                  local_368.m_progress_start = 0;
                  local_368.m_progress_range = 100;
                  local_368.m_use_transparent_indices_for_black = false;
                  local_368.m_pTask_pool = (task_pool *)0x0;
                  local_368.m_endpoint_caching =
                       crnlib::command_line_params::get_value_as_bool
                                 (&cmd_line_params,"endpointcaching",0,false);
                  local_368.m_quality = cCRNDXTQualityNormal;
                  local_368.m_compressor = cCRNDXTCompressorCRN;
                  local_368.m_perceptual = bVar2;
                  bVar3 = crnlib::command_line_params::get_value_as_bool
                                    (&cmd_line_params,"multithreaded",0,true);
                  uVar8 = crnlib::g_number_of_processors - 1;
                  if (!bVar3) {
                    uVar8 = 0;
                  }
                  local_368.m_num_helper_threads = uVar8;
                  local_368.m_pProgress_callback = progress_callback;
                  crnlib::timer::timer(&t);
                  crnlib::timer::start(&t);
                  bVar3 = crnlib::mipmapped_texture::convert(&tex1,PIXEL_FMT_ETC1,false,&local_368);
                  if (bVar3) {
                    dVar20 = crnlib::timer::get_elapsed_secs(&t);
                    crnlib::console::printf("Elapsed time: %3.3f",dVar20);
                    crnlib::console::printf("Compress 2");
                    crnlib::mipmapped_texture::mipmapped_texture(&tex2,&orig_tex);
                    local_368.m_endpoint_caching = false;
                    local_368.m_quality = cCRNDXTQualitySuperFast;
                    local_368.m_compressor = cCRNDXTCompressorCRN;
                    crnlib::timer::start(&t);
                    bVar3 = crnlib::mipmapped_texture::convert
                                      (&tex2,PIXEL_FMT_ETC1,false,&local_368);
                    if (bVar3) {
                      dVar21 = crnlib::timer::get_elapsed_secs(&t);
                      crnlib::console::printf("Elapsed time: %3.3f",dVar21);
                      orig_img.m_width = 0xff000000;
                      uVar16 = 0xf;
                      crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::image
                                (&hybrid_img,img.m_width,img.m_height,0xffffffff,
                                 (color_quad<unsigned_char,_int> *)&orig_img,0xf);
                      local_410 = local_410 + dVar21;
                      uVar10 = 0;
                      while( true ) {
                        if (orig_tex.m_faces.m_size == 0) {
                          uVar6 = 0;
                        }
                        else {
                          uVar6 = (ulong)(orig_tex.m_faces.m_p)->m_size;
                        }
                        if (uVar6 <= uVar10) break;
                        orig_img.m_width = 0;
                        orig_img.m_height = 0;
                        orig_img.m_pitch = 0;
                        orig_img.m_total = 0;
                        orig_img.m_comp_flags = 0xf;
                        orig_img.m_pixel_buf.m_size = 0;
                        orig_img.m_pixel_buf.m_capacity = 0;
                        orig_img.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
                        orig_img.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
                        img1.m_width = 0;
                        img1.m_height = 0;
                        img1.m_pitch = 0;
                        img1.m_total = 0;
                        img1.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
                        img1.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
                        img1.m_pixel_buf.m_size = 0;
                        img1.m_pixel_buf.m_capacity = 0;
                        img2.m_width = 0;
                        img2.m_height = 0;
                        img2.m_pitch = 0;
                        img2.m_total = 0;
                        img2.m_pixel_buf.m_size = 0;
                        img2.m_pixel_buf.m_capacity = 0;
                        img2.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
                        img2.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
                        img2.m_comp_flags = orig_img.m_comp_flags;
                        img1.m_comp_flags = orig_img.m_comp_flags;
                        a_00 = crnlib::mip_level::get_unpacked_image
                                         ((orig_tex.m_faces.m_p)->m_p[uVar10],&orig_img,3);
                        b_00 = crnlib::mip_level::get_unpacked_image
                                         ((tex1.m_faces.m_p)->m_p[uVar10],&img1,3);
                        b_01 = crnlib::mip_level::get_unpacked_image
                                         ((tex2.m_faces.m_p)->m_p[uVar10],&img2,3);
                        metrics[1].m_p = (error_metrics *)0x0;
                        metrics[1].m_size = 0;
                        metrics[1].m_capacity = 0;
                        metrics[0].m_p = (error_metrics *)0x0;
                        metrics[0].m_size = 0;
                        metrics[0].m_capacity = 0;
                        num_blocks_x = a_00->m_width + 3 >> 2;
                        uVar4 = a_00->m_height + 3 >> 2;
                        uVar7 = 0;
                        while( true ) {
                          num_blocks_y = (uint)uVar16;
                          if (uVar7 == uVar4) break;
                          uVar8 = uVar7 * 4;
                          x_00 = 0;
                          uVar17 = num_blocks_x;
                          local_320 = (ulong)uVar7;
                          while( true ) {
                            bVar19 = uVar17 == 0;
                            uVar17 = uVar17 - 1;
                            if (bVar19) break;
                            crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::extract_block
                                      (a_00,o.m_pPixels,x_00,uVar8,4,4,false);
                            crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::extract_block
                                      (b_00,a.m_pPixels,x_00,uVar8,4,4,false);
                            crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::extract_block
                                      (b_01,b.m_pPixels,x_00,uVar8,4,4,false);
                            em.mMeanSquared = 0.0;
                            em.mRootMeanSquared = 0.0;
                            em.mMax = 0;
                            em._4_4_ = 0;
                            em.mMean = 0.0;
                            em.mPeakSNR = 0.0;
                            crnlib::image_utils::error_metrics::compute
                                      (&em,&o,&a,0,num_channels,true);
                            em2.mMeanSquared = 0.0;
                            em2.mRootMeanSquared = 0.0;
                            em2.mMax = 0;
                            em2._4_4_ = 0;
                            em2.mMean = 0.0;
                            em2.mPeakSNR = 0.0;
                            uVar16 = 1;
                            crnlib::image_utils::error_metrics::compute
                                      (&em2,&o,&b,0,num_channels,true);
                            crnlib::vector<crnlib::image_utils::error_metrics>::push_back
                                      (metrics,&em);
                            crnlib::vector<crnlib::image_utils::error_metrics>::push_back
                                      (metrics + 1,&em2);
                            piVar14 = &a;
                            if (em.mPeakSNR < em2.mPeakSNR) {
                              add_bad_block(this,&o);
                              piVar14 = &b;
                            }
                            crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::blit
                                      (&hybrid_img,x_00,uVar8,piVar14);
                            x_00 = x_00 + 4;
                          }
                          uVar7 = (int)local_320 + 1;
                        }
                        bVar19 = crnlib::command_line_params::has_key
                                           (&cmd_line_params,"writehybrid");
                        if (bVar19) {
                          crnlib::image_utils::write_to_file("hybrid.tga",&hybrid_img,1,-1);
                        }
                        crnlib::console::printf
                                  ("---- Mip level: %u, Total blocks: %ux%u, %u",uVar10,
                                   (ulong)num_blocks_x,(ulong)uVar4,(ulong)(uVar4 * num_blocks_x));
                        pcVar11 = "Compressor 1:";
                        crnlib::console::printf("Compressor 1:");
                        print_metric_stats((corpus_tester *)pcVar11,metrics,num_blocks_x,uVar4);
                        pcVar11 = "Compressor 2:";
                        crnlib::console::printf("Compressor 2:");
                        print_metric_stats((corpus_tester *)pcVar11,metrics + 1,num_blocks_x,uVar4);
                        pcVar11 = "Compressor 1 vs. 2:";
                        crnlib::console::printf("Compressor 1 vs. 2:");
                        print_comparative_metric_stats
                                  ((corpus_tester *)pcVar11,&cmd_line_params,metrics,metrics + 1,
                                   num_blocks_x,num_blocks_y);
                        em.mMeanSquared = 0.0;
                        em.mRootMeanSquared = 0.0;
                        em.mMax = 0;
                        em._4_4_ = 0;
                        em.mMean = 0.0;
                        em.mPeakSNR = 0.0;
                        crnlib::image_utils::error_metrics::compute
                                  (&em,a_00,b_00,0,num_channels,true);
                        crnlib::image_utils::error_metrics::print(&em,"Compressor 1: ");
                        crnlib::image_utils::error_metrics::compute
                                  (&em,a_00,b_01,0,num_channels,true);
                        crnlib::image_utils::error_metrics::print(&em,"Compressor 2: ");
                        uVar16 = 1;
                        crnlib::image_utils::error_metrics::compute
                                  (&em,a_00,&hybrid_img,0,num_channels,true);
                        crnlib::image_utils::error_metrics::print(&em,"Best of Both: ");
                        lVar13 = 0x10;
                        do {
                          crnlib::vector<crnlib::image_utils::error_metrics>::~vector
                                    ((vector<crnlib::image_utils::error_metrics> *)
                                     ((long)&metrics[0].m_p + lVar13));
                          lVar13 = lVar13 + -0x10;
                        } while (lVar13 != -0x10);
                        crnlib::vector<crnlib::color_quad<unsigned_char,_int>_>::~vector
                                  (&img2.m_pixel_buf);
                        crnlib::vector<crnlib::color_quad<unsigned_char,_int>_>::~vector
                                  (&img1.m_pixel_buf);
                        crnlib::vector<crnlib::color_quad<unsigned_char,_int>_>::~vector
                                  (&orig_img.m_pixel_buf);
                        uVar10 = uVar10 + 1;
                      }
                      crnlib::vector<crnlib::color_quad<unsigned_char,_int>_>::~vector
                                (&hybrid_img.m_pixel_buf);
                    }
                    else {
                      crnlib::console::error("Texture conversion failed!");
                    }
                    local_408 = local_408 + dVar20;
                    crnlib::mipmapped_texture::~mipmapped_texture(&tex2);
                  }
                  else {
                    bVar3 = false;
                    crnlib::console::error("Texture conversion failed!");
                  }
                  crnlib::mipmapped_texture::~mipmapped_texture(&tex1);
                  crnlib::mipmapped_texture::~mipmapped_texture(&orig_tex);
                  crnlib::vector<crnlib::color_quad<unsigned_char,_int>_>::~vector(&img.m_pixel_buf)
                  ;
                  if (bVar3 == false) goto LAB_00107670;
                }
                else {
                  pcVar11 = *ppcVar12;
                  if (pcVar11 == (char *)0x0) {
                    pcVar11 = "";
                  }
                  crnlib::console::warning("Failed loading image file: %s",pcVar11);
                  crnlib::vector<crnlib::color_quad<unsigned_char,_int>_>::~vector(&img.m_pixel_buf)
                  ;
                }
                uVar10 = local_328 + 1;
              }
              bVar18 = false;
LAB_00107670:
              crnlib::vector<crnlib::color_quad<unsigned_char,_int>_>::~vector(&b.m_pixel_buf);
              crnlib::vector<crnlib::color_quad<unsigned_char,_int>_>::~vector(&a.m_pixel_buf);
              crnlib::vector<crnlib::color_quad<unsigned_char,_int>_>::~vector(&o.m_pixel_buf);
              crnlib::vector<crnlib::find_files::file_desc>::~vector(&file_finder.m_files);
              uVar10 = local_330;
              if (!bVar18) goto LAB_001076b0;
            }
            bVar18 = false;
            goto LAB_00107755;
          }
          pcVar11 = (char *)*pp_Var9;
          if ((_Base_ptr)pcVar11 == (_Base_ptr)0x0) {
            pcVar11 = "";
          }
          crnlib::console::warning("Failed finding files: %s",pcVar11);
          crnlib::vector<crnlib::find_files::file_desc>::~vector(&file_finder.m_files);
LAB_001076b0:
          uVar4 = *(uint *)&p_Var5[1]._M_right;
        }
      }
    }
    flush_bad_blocks(this);
    crnlib::console::printf("Total times: %4.3f vs. %4.3f",local_408,local_410);
    bVar18 = true;
  }
LAB_00107755:
  crnlib::command_line_params::~command_line_params(&cmd_line_params);
  return bVar18;
}

Assistant:

bool corpus_tester::test(const char* pCmd_line)
    {
        console::printf("Command line:\n\"%s\"", pCmd_line);

        static const command_line_params::param_desc param_desc_array[] =
        {
            { "corpus_test", 0, false },
            { "in", 1, true },
            { "deep", 0, false },
            { "alpha", 0, false },
            { "nomips", 0, false },
            { "perceptual", 0, false },
            { "endpointcaching", 0, false },
            { "multithreaded", 0, false },
            { "writehybrid", 0, false },
            { "nobadblocks", 0, false },
        };

        command_line_params cmd_line_params;
        if (!cmd_line_params.parse(pCmd_line, CRNLIB_ARRAY_SIZE(param_desc_array), param_desc_array, true))
        {
            return false;
        }

        double total_time1 = 0, total_time2 = 0;

        command_line_params::param_map_const_iterator it = cmd_line_params.begin();
        for (; it != cmd_line_params.end(); ++it)
        {
            if (it->first != "in")
            {
                continue;
            }
            if (it->second.m_values.empty())
            {
                console::error("Must follow /in parameter with a filename!\n");
                return false;
            }

            for (uint in_value_index = 0; in_value_index < it->second.m_values.size(); in_value_index++)
            {
                const dynamic_string& filespec = it->second.m_values[in_value_index];

                find_files file_finder;
                if (!file_finder.find(filespec.get_ptr(), find_files::cFlagAllowFiles | (cmd_line_params.has_key("deep") ? find_files::cFlagRecursive : 0)))
                {
                    console::warning("Failed finding files: %s", filespec.get_ptr());
                    continue;
                }

                if (file_finder.get_files().empty())
                {
                    console::warning("No files found: %s", filespec.get_ptr());
                    return false;
                }

                const find_files::file_desc_vec& files = file_finder.get_files();

                image_u8 o(4, 4), a(4, 4), b(4, 4);

                uint first_channel = 0;
                uint num_channels = 3;
                bool perceptual = cmd_line_params.get_value_as_bool("perceptual", false);
                if (perceptual)
                {
                    first_channel = 0;
                    num_channels = 0;
                }
                console::printf("Perceptual mode: %u", perceptual);

                for (uint file_index = 0; file_index < files.size(); file_index++)
                {
                    const find_files::file_desc& file_desc = files[file_index];

                    console::printf("-------- Loading image: %s", file_desc.m_fullname.get_ptr());

                    image_u8 img;
                    if (!image_utils::read_from_file(img, file_desc.m_fullname.get_ptr(), 0))
                    {
                        console::warning("Failed loading image file: %s", file_desc.m_fullname.get_ptr());
                        continue;
                    }

                    if ((!cmd_line_params.has_key("alpha")) && img.is_component_valid(3))
                    {
                        for (uint y = 0; y < img.get_height(); y++)
                        {
                            for (uint x = 0; x < img.get_width(); x++)
                            {
                                img(x, y).a = 255;
                            }
                        }

                        img.set_component_valid(3, false);
                    }

                    mipmapped_texture orig_tex;
                    orig_tex.assign(crnlib_new<image_u8>(img));

                    if (!cmd_line_params.has_key("nomips"))
                    {
                        mipmapped_texture::generate_mipmap_params genmip_params;
                        genmip_params.m_srgb = true;

                        console::printf("Generating mipmaps");

                        if (!orig_tex.generate_mipmaps(genmip_params, false))
                        {
                            console::error("Mipmap generation failed!");
                            return false;
                        }
                    }

                    console::printf("Compress 1");

                    mipmapped_texture tex1(orig_tex);
                    dxt_image::pack_params convert_params;
                    convert_params.m_endpoint_caching = cmd_line_params.get_value_as_bool("endpointcaching", 0, false);
                    convert_params.m_compressor = cCRNDXTCompressorCRN;
                    convert_params.m_quality = cCRNDXTQualityNormal;
                    convert_params.m_perceptual = perceptual;
                    convert_params.m_num_helper_threads = cmd_line_params.get_value_as_bool("multithreaded", 0, true) ? (g_number_of_processors - 1) : 0;
                    convert_params.m_pProgress_callback = progress_callback;
                    timer t;
                    t.start();
                    if (!tex1.convert(PIXEL_FMT_ETC1, false, convert_params))
                    {
                        console::error("Texture conversion failed!");
                        return false;
                    }
                    double time1 = t.get_elapsed_secs();
                    total_time1 += time1;
                    console::printf("Elapsed time: %3.3f", time1);

                    console::printf("Compress 2");

                    mipmapped_texture tex2(orig_tex);
                    convert_params.m_endpoint_caching = false;
                    convert_params.m_compressor = cCRNDXTCompressorCRN;
                    convert_params.m_quality = cCRNDXTQualitySuperFast;
                    t.start();
                    if (!tex2.convert(PIXEL_FMT_ETC1, false, convert_params))
                    {
                        console::error("Texture conversion failed!");
                        return false;
                    }
                    double time2 = t.get_elapsed_secs();
                    total_time2 += time2;
                    console::printf("Elapsed time: %3.3f", time2);

                    image_u8 hybrid_img(img.get_width(), img.get_height());

                    for (uint l = 0; l < orig_tex.get_num_levels(); l++)
                    {
                        image_u8 orig_img, img1, img2;

                        image_u8* pOrig = orig_tex.get_level(0, l)->get_unpacked_image(orig_img, cUnpackFlagUncook | cUnpackFlagUnflip);
                        image_u8* pImg1 = tex1.get_level(0, l)->get_unpacked_image(img1, cUnpackFlagUncook | cUnpackFlagUnflip);
                        image_u8* pImg2 = tex2.get_level(0, l)->get_unpacked_image(img2, cUnpackFlagUncook | cUnpackFlagUnflip);

                        const uint num_blocks_x = pOrig->get_block_width(4);
                        const uint num_blocks_y = pOrig->get_block_height(4);

                        crnlib::vector<image_utils::error_metrics> metrics[2];

                        for (uint by = 0; by < num_blocks_y; by++)
                        {
                            for (uint bx = 0; bx < num_blocks_x; bx++)
                            {
                                pOrig->extract_block(o.get_ptr(), bx * 4, by * 4, 4, 4);
                                pImg1->extract_block(a.get_ptr(), bx * 4, by * 4, 4, 4);
                                pImg2->extract_block(b.get_ptr(), bx * 4, by * 4, 4, 4);

                                image_utils::error_metrics em1;
                                em1.compute(o, a, first_channel, num_channels);

                                image_utils::error_metrics em2;
                                em2.compute(o, b, first_channel, num_channels);

                                metrics[0].push_back(em1);
                                metrics[1].push_back(em2);

                                if (em1.mPeakSNR < em2.mPeakSNR)
                                {
                                    add_bad_block(o);

                                    hybrid_img.blit(bx * 4, by * 4, b);
                                }
                                else
                                {
                                    hybrid_img.blit(bx * 4, by * 4, a);
                                }
                            }
                        }

                        if (cmd_line_params.has_key("writehybrid"))
                        {
                            image_utils::write_to_file("hybrid.tga", hybrid_img, image_utils::cWriteFlagIgnoreAlpha);
                        }

                        console::printf("---- Mip level: %u, Total blocks: %ux%u, %u", l, num_blocks_x, num_blocks_y, num_blocks_x * num_blocks_y);

                        console::printf("Compressor 1:");
                        print_metric_stats(metrics[0], num_blocks_x, num_blocks_y);

                        console::printf("Compressor 2:");
                        print_metric_stats(metrics[1], num_blocks_x, num_blocks_y);

                        console::printf("Compressor 1 vs. 2:");
                        print_comparative_metric_stats(cmd_line_params, metrics[0], metrics[1], num_blocks_x, num_blocks_y);

                        image_utils::error_metrics em;

                        em.compute(*pOrig, *pImg1, 0, perceptual ? 0 : 3);
                        em.print("Compressor 1: ");

                        em.compute(*pOrig, *pImg2, 0, perceptual ? 0 : 3);
                        em.print("Compressor 2: ");

                        em.compute(*pOrig, hybrid_img, 0, perceptual ? 0 : 3);
                        em.print("Best of Both: ");
                    }
                }
            } // file_index
        }

        flush_bad_blocks();

        console::printf("Total times: %4.3f vs. %4.3f", total_time1, total_time2);

        return true;
    }